

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_stream.c
# Opt level: O2

void read_rbsp_slice_trailing_bits(h264_stream_t *h,bs_t *b)

{
  read_rbsp_trailing_bits(b);
  if (h->pps->entropy_coding_mode_flag != 0) {
    while (b->p < b->end) {
      bs_skip_u(b,0x10);
    }
  }
  return;
}

Assistant:

void read_rbsp_slice_trailing_bits(h264_stream_t* h, bs_t* b)
{
    read_rbsp_trailing_bits(b);
    if( h->pps->entropy_coding_mode_flag )
    {
        while( more_rbsp_trailing_data(h, b) )
        {
            /* cabac_zero_word */ bs_skip_u(b, 16);
        }
    }
}